

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O1

double inform_bin(double *series,size_t n,int b,int *binned,inform_error *err)

{
  double dVar1;
  double dVar2;
  inform_error iVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  double local_48;
  
  if (series == (double *)0x0) {
LAB_00108cd9:
    iVar3 = INFORM_ETIMESERIES;
  }
  else if (n == 0) {
    iVar3 = INFORM_ESHORTSERIES;
  }
  else {
    if (1 < b) {
      if (binned != (int *)0x0) {
        dVar9 = *series;
        uVar7 = SUB84(dVar9,0);
        uVar8 = (undefined4)((ulong)dVar9 >> 0x20);
        dVar10 = dVar9;
        if (n != 1) {
          sVar4 = 1;
          do {
            dVar10 = series[sVar4];
            dVar1 = dVar10;
            if (dVar9 <= dVar10) {
              dVar1 = dVar9;
            }
            dVar9 = dVar1;
            if (dVar10 <= (double)CONCAT44(uVar8,uVar7)) {
              dVar10 = (double)CONCAT44(uVar8,uVar7);
            }
            sVar4 = sVar4 + 1;
            uVar7 = SUB84(dVar10,0);
            uVar8 = (undefined4)((ulong)dVar10 >> 0x20);
          } while (n != sVar4);
        }
        local_48 = (dVar10 - dVar9) / (double)b;
        if (2.220446049250313e-15 < local_48) {
          lVar6 = 0;
          do {
            dVar1 = series[lVar6];
            dVar2 = floor((dVar1 - dVar9) / local_48);
            uVar5 = (int)dVar2 - (uint)(dVar1 == dVar10);
            binned[lVar6] = uVar5;
            if ((uint)b <= uVar5) {
              __assert_fail("0 <= binned[i] && binned[i] < b",
                            "/workspace/llm4binary/github/license_c_cmakelists/ELIFE-ASU[P]Inform/src/utilities/binning.c"
                            ,0x36,
                            "double inform_bin(const double *, size_t, int, int *, inform_error *)")
              ;
            }
            lVar6 = lVar6 + 1;
          } while (n + (n == 0) != lVar6);
          return local_48;
        }
        memset(binned,0,n << 2);
        iVar3 = INFORM_EBIN;
        goto LAB_00108ce7;
      }
      goto LAB_00108cd9;
    }
    iVar3 = INFORM_EBIN;
  }
  local_48 = 0.0;
LAB_00108ce7:
  if (err != (inform_error *)0x0) {
    *err = iVar3;
  }
  return local_48;
}

Assistant:

double inform_bin(double const *series, size_t n, int b, int *binned,
    inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0.0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0.0);
    else if (b < 2)
        INFORM_ERROR_RETURN(err, INFORM_EBIN, 0.0);
    else if (binned == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0.0);

    double min, max;
    double range = inform_range(series, n, &min, &max, err);
    double step = range / b;

    if (step <= 10.*DBL_EPSILON)
    {
        memset(binned, 0, n*sizeof(int));
        INFORM_ERROR_RETURN(err, INFORM_EBIN, step);
    }

    for (size_t i = 0; i < n; ++i)
    {
        binned[i] = (int) floor((series[i] - min) / step) - (series[i] == max);
        assert(0 <= binned[i] && binned[i] < b);
    }

    return step;
}